

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O2

uint GGUFMeta::GKV<unsigned_int>::get_kv(gguf_context *ctx,int k)

{
  int iVar1;
  uint uVar2;
  runtime_error *this;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  string local_40;
  
  iVar1 = gguf_get_kv_type(ctx,(long)k);
  if (iVar1 == 4) {
    uVar2 = GKV_Base_Type<unsigned_int,_(gguf_type)4,_&gguf_get_val_u32>::getter(ctx,k);
    return uVar2;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  uVar3 = gguf_get_key(ctx,(long)k);
  uVar4 = gguf_type_name(iVar1);
  uVar5 = gguf_type_name(4);
  format_abi_cxx11_(&local_40,"key %s has wrong type %s but expected type %s",uVar3,uVar4,uVar5);
  std::runtime_error::runtime_error(this,(string *)&local_40);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static T get_kv(const gguf_context * ctx, const int k) {
            const enum gguf_type kt = gguf_get_kv_type(ctx, k);

            if (kt != GKV::gt) {
                throw std::runtime_error(format("key %s has wrong type %s but expected type %s",
                    gguf_get_key(ctx, k), gguf_type_name(kt), gguf_type_name(GKV::gt)));
            }
            return GKV::getter(ctx, k);
        }